

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O0

int tclpkcs11_setpin(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  ProcErrorProc *pPVar1;
  Tcl_Interp *pTVar2;
  int iVar3;
  Tcl_Obj *pTVar4;
  CK_RV errorCode;
  CK_USER_TYPE tpin;
  CK_RV chk1_rv;
  CK_RV chk_rv;
  CK_SLOT_ID slotid;
  int tcl_rv;
  int typepin_len;
  char *typepin;
  char *pcStack_90;
  int newpin_len;
  char *newpin;
  char *pcStack_80;
  int oldpin_len;
  char *oldpin;
  long slotid_long;
  Tcl_Obj *tcl_typepin;
  Tcl_Obj *tcl_newpin;
  Tcl_Obj *tcl_oldpin;
  Tcl_Obj *tcl_slotid;
  Tcl_Obj *tcl_handle;
  Tcl_HashEntry *tcl_handle_entry;
  tclpkcs11_handle *handle;
  tclpkcs11_interpdata *interpdata;
  Tcl_Obj **objv_local;
  Tcl_Interp *pTStack_20;
  int objc_local;
  Tcl_Interp *interp_local;
  ClientData cd_local;
  
  interpdata = (tclpkcs11_interpdata *)objv;
  objv_local._4_4_ = objc;
  pTStack_20 = interp;
  interp_local = (Tcl_Interp *)cd;
  if (cd == (ClientData)0x0) {
    pPVar1 = tclStubsPtr->tcl_SetObjResult;
    pTVar4 = (*tclStubsPtr->tcl_NewStringObj)("invalid clientdata",-1);
    (*pPVar1)((Tcl_Interp_conflict *)interp,pTVar4);
    cd_local._4_4_ = 1;
  }
  else if (objc == 6) {
    tcl_slotid = objv[1];
    tcl_oldpin = objv[2];
    slotid_long = (long)objv[3];
    tcl_newpin = objv[4];
    tcl_typepin = objv[5];
    handle = (tclpkcs11_handle *)cd;
    tcl_handle = (Tcl_Obj *)(**(code **)((long)cd + 0x40))(cd,tcl_slotid);
    pTVar2 = pTStack_20;
    if (tcl_handle == (Tcl_Obj *)0x0) {
      pPVar1 = tclStubsPtr->tcl_SetObjResult;
      pTVar4 = (*tclStubsPtr->tcl_NewStringObj)("invalid handle",-1);
      (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
      cd_local._4_4_ = 1;
    }
    else {
      tcl_handle_entry = (Tcl_HashEntry *)tcl_handle->typePtr;
      if ((Tcl_ObjType *)tcl_handle_entry == (Tcl_ObjType *)0x0) {
        pPVar1 = tclStubsPtr->tcl_SetObjResult;
        pTVar4 = (*tclStubsPtr->tcl_NewStringObj)("invalid handle",-1);
        (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
        cd_local._4_4_ = 1;
      }
      else {
        slotid._0_4_ = (*tclStubsPtr->tcl_GetLongFromObj)
                                 ((Tcl_Interp_conflict *)pTStack_20,tcl_oldpin,(long *)&oldpin);
        cd_local._4_4_ = (int)slotid;
        if ((int)slotid == 0) {
          iVar3 = tclpkcs11_start_session((tclpkcs11_handle *)tcl_handle_entry,(CK_SLOT_ID)oldpin);
          pTVar2 = pTStack_20;
          if ((long)iVar3 == 0) {
            _tcl_rv = (int *)(*tclStubsPtr->tcl_GetStringFromObj)
                                       ((Tcl_Obj *)slotid_long,(int *)((long)&slotid + 4));
            pcStack_80 = (*tclStubsPtr->tcl_GetStringFromObj)(tcl_newpin,(int *)((long)&newpin + 4))
            ;
            if ((slotid._4_4_ == 2) && ((short)*_tcl_rv == 0x6f73)) {
              chk1_rv = (CK_RV)(*tcl_handle_entry->tablePtr[1].findProc)
                                         ((Tcl_HashTable *)(tcl_handle_entry->key).oneWordValue,
                                          (char *)0x0);
            }
            else {
              if ((slotid._4_4_ != 4) || (*_tcl_rv != 0x72657375)) {
                (*tclStubsPtr->tcl_SetObjResult)
                          ((Tcl_Interp_conflict *)pTStack_20,
                           (Tcl_Obj *)"setpin: bad type (so or user)");
                return 1;
              }
              chk1_rv = (CK_RV)(*tcl_handle_entry->tablePtr[1].findProc)
                                         ((Tcl_HashTable *)(tcl_handle_entry->key).oneWordValue,
                                          (char *)0x1);
            }
            pTVar2 = pTStack_20;
            if (chk1_rv == 0) {
              pcStack_90 = (*tclStubsPtr->tcl_GetStringFromObj)
                                     (tcl_typepin,(int *)((long)&typepin + 4));
              errorCode = (*(code *)tcl_handle_entry->tablePtr[1].staticBuckets[0])
                                    ((tcl_handle_entry->key).oneWordValue,pcStack_80,
                                     (long)newpin._4_4_,pcStack_90,(long)typepin._4_4_);
              (*(code *)tcl_handle_entry->tablePtr[1].staticBuckets[2])
                        ((tcl_handle_entry->key).oneWordValue);
              pTVar2 = pTStack_20;
              if (errorCode == 0) {
                pPVar1 = tclStubsPtr->tcl_SetObjResult;
                pTVar4 = (*tclStubsPtr->tcl_NewIntObj)(1);
                (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
                cd_local._4_4_ = 0;
              }
              else if (errorCode == 0xa0) {
                pPVar1 = tclStubsPtr->tcl_SetObjResult;
                pTVar4 = (*tclStubsPtr->tcl_NewIntObj)(0);
                (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
                cd_local._4_4_ = 0;
              }
              else {
                pPVar1 = tclStubsPtr->tcl_SetObjResult;
                pTVar4 = tclpkcs11_pkcs11_error(errorCode);
                (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
                cd_local._4_4_ = 1;
              }
            }
            else if (chk1_rv == 0xa0) {
              pPVar1 = tclStubsPtr->tcl_SetObjResult;
              pTVar4 = (*tclStubsPtr->tcl_NewIntObj)(0);
              (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
              cd_local._4_4_ = 0;
            }
            else {
              pPVar1 = tclStubsPtr->tcl_SetObjResult;
              pTVar4 = tclpkcs11_pkcs11_error(chk1_rv);
              (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
              cd_local._4_4_ = 1;
            }
          }
          else {
            pPVar1 = tclStubsPtr->tcl_SetObjResult;
            pTVar4 = tclpkcs11_pkcs11_error((long)iVar3);
            (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
            cd_local._4_4_ = 1;
          }
        }
      }
    }
  }
  else {
    pPVar1 = tclStubsPtr->tcl_SetObjResult;
    pTVar4 = (*tclStubsPtr->tcl_NewStringObj)
                       ("wrong # args: should be \"pki::pkcs11::setpin handle slot typepin oldpin newpin\""
                        ,-1);
    (*pPVar1)((Tcl_Interp_conflict *)interp,pTVar4);
    cd_local._4_4_ = 1;
  }
  return cd_local._4_4_;
}

Assistant:

MODULE_SCOPE int tclpkcs11_setpin(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_Obj *tcl_handle, *tcl_slotid, *tcl_oldpin, *tcl_newpin, *tcl_typepin;
  long slotid_long;
  char *oldpin;
  int oldpin_len;
  char *newpin;
  int newpin_len;
  char *typepin;
  int typepin_len;
  int tcl_rv;

  CK_SLOT_ID slotid;
  CK_RV chk_rv;
  CK_RV chk1_rv;
  CK_USER_TYPE tpin;

  if (!cd) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid clientdata", -1));

    return(TCL_ERROR);
  }

  if (objc != 6) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("wrong # args: should be \"pki::pkcs11::setpin handle slot typepin oldpin newpin\"", -1));

    return(TCL_ERROR);
  }

  tcl_handle = objv[1];
  tcl_slotid = objv[2];
  tcl_typepin = objv[3];
  tcl_oldpin = objv[4];
  tcl_newpin = objv[5];

  interpdata = (struct tclpkcs11_interpdata *) cd;

  tcl_handle_entry = Tcl_FindHashEntry(&interpdata->handles, (const char *) tcl_handle);
  if (!tcl_handle_entry) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);
  if (!handle) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  tcl_rv = Tcl_GetLongFromObj(interp, tcl_slotid, &slotid_long);
  if (tcl_rv != TCL_OK) {
    return(tcl_rv);
  }

  slotid = slotid_long;

  chk_rv = tclpkcs11_start_session(handle, slotid);
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));
    return(TCL_ERROR);
  }
  typepin = Tcl_GetStringFromObj(tcl_typepin, &typepin_len);
  oldpin = Tcl_GetStringFromObj(tcl_oldpin, &oldpin_len);
  if (typepin_len == 2 && !memcmp(typepin, "so", 2)) {
    chk_rv = handle->pkcs11->C_Login(handle->session, CKU_SO, (CK_UTF8CHAR_PTR) oldpin, oldpin_len);
  } else if (typepin_len == 4 && !memcmp(typepin, "user", 4)) {
    chk_rv = handle->pkcs11->C_Login(handle->session, CKU_USER, (CK_UTF8CHAR_PTR) oldpin, oldpin_len);
  } else {
      Tcl_SetObjResult(interp, "setpin: bad type (so or user)");
      return(TCL_ERROR);
  }
  if (chk_rv != CKR_OK) {
      if (chk_rv == CKR_PIN_INCORRECT) {
          Tcl_SetObjResult(interp, Tcl_NewBooleanObj(0));
          return(TCL_OK);
      }
      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));
      return(TCL_ERROR);
  }
  newpin = Tcl_GetStringFromObj(tcl_newpin, &newpin_len);
  chk1_rv = handle->pkcs11->C_SetPIN(handle->session, (CK_UTF8CHAR_PTR)oldpin, oldpin_len, (CK_UTF8CHAR_PTR)newpin, newpin_len);

  handle->pkcs11->C_CloseSession(handle->session);

  if (chk1_rv != CKR_OK) {
      if (chk1_rv == CKR_PIN_INCORRECT) {
          Tcl_SetObjResult(interp, Tcl_NewBooleanObj(0));
          return(TCL_OK);
      }
      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk1_rv));
      return(TCL_ERROR);
  }

  Tcl_SetObjResult(interp, Tcl_NewBooleanObj(1));
  return(TCL_OK);
}